

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::get_crop
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_int> *this,int x0,int y0,int z0,
          int c0,int x1,int y1,int z1,int c1,bool boundary_conditions)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  CImg<unsigned_int> *this_00;
  CImgInstanceException *this_01;
  long lVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  int x;
  long lVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  long local_70;
  
  bVar4 = is_empty(this);
  if (bVar4) {
    this_01 = (CImgInstanceException *)__cxa_allocate_exception(0x4008);
    pcVar12 = "non-";
    if (this->_is_shared != false) {
      pcVar12 = "";
    }
    CImgInstanceException::CImgInstanceException
              (this_01,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::crop(): Empty instance.",
               (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar12,"unsigned int");
    __cxa_throw(this_01,&CImgInstanceException::typeinfo,std::exception::~exception);
  }
  uVar5 = x1;
  if (x0 < x1) {
    uVar5 = x0;
  }
  uVar14 = x1 ^ x0 ^ uVar5;
  uVar1 = y1;
  if (y0 < y1) {
    uVar1 = y0;
  }
  uVar13 = y1 ^ y0 ^ uVar1;
  uVar2 = z1;
  if (z0 < z1) {
    uVar2 = z0;
  }
  uVar9 = z1 ^ z0 ^ uVar2;
  uVar3 = c1;
  if (c0 < c1) {
    uVar3 = c0;
  }
  uVar15 = c1 ^ c0 ^ uVar3;
  CImg(__return_storage_ptr__,(uVar14 - uVar5) + 1,(uVar13 - uVar1) + 1,(uVar9 - uVar2) + 1,
       (uVar15 - uVar3) + 1);
  if ((((((int)uVar5 < 0) || ((int)uVar1 < 0)) || ((int)this->_width <= (int)uVar14)) ||
      (((int)uVar2 < 0 || ((int)this->_height <= (int)uVar13)))) ||
     (((int)uVar3 < 0 ||
      (((int)this->_depth <= (int)uVar9 ||
       (this_00 = __return_storage_ptr__, (int)this->_spectrum <= (int)uVar15)))))) {
    if (boundary_conditions) {
      if (x1 < x0) {
        x0 = x1;
      }
      local_70 = 0;
      for (lVar8 = 0; lVar8 < (int)__return_storage_ptr__->_spectrum; lVar8 = lVar8 + 1) {
        lVar16 = 0;
        for (lVar7 = 0; lVar7 < (int)__return_storage_ptr__->_depth; lVar7 = lVar7 + 1) {
          lVar10 = 0;
          for (lVar6 = 0; lVar6 < (int)__return_storage_ptr__->_height; lVar6 = lVar6 + 1) {
            for (lVar11 = 0; lVar11 < (int)__return_storage_ptr__->_width; lVar11 = lVar11 + 1) {
              uVar5 = _atXYZC(this,x0 + (int)lVar11,uVar1 + (int)lVar6,uVar2 + (int)lVar7,
                              uVar3 + (int)lVar8);
              *(uint *)((long)__return_storage_ptr__->_data +
                       lVar11 * 4 +
                       (((ulong)__return_storage_ptr__->_depth * local_70 + lVar16) *
                        (ulong)__return_storage_ptr__->_height + lVar10) *
                       (ulong)__return_storage_ptr__->_width) = uVar5;
            }
            lVar10 = lVar10 + 4;
          }
          lVar16 = lVar16 + 4;
        }
        local_70 = local_70 + 4;
      }
      return __return_storage_ptr__;
    }
    this_00 = fill(__return_storage_ptr__,0);
  }
  draw_image(this_00,-uVar5,-uVar1,-uVar2,-uVar3,this,1.0);
  return __return_storage_ptr__;
}

Assistant:

CImg<T> get_crop(const int x0, const int y0, const int z0, const int c0,
                     const int x1, const int y1, const int z1, const int c1,
                     const bool boundary_conditions=false) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "crop(): Empty instance.",
                                    cimg_instance);
      const int
        nx0 = x0<x1?x0:x1, nx1 = x0^x1^nx0,
        ny0 = y0<y1?y0:y1, ny1 = y0^y1^ny0,
        nz0 = z0<z1?z0:z1, nz1 = z0^z1^nz0,
        nc0 = c0<c1?c0:c1, nc1 = c0^c1^nc0;
      CImg<T> res(1U + nx1 - nx0,1U + ny1 - ny0,1U + nz1 - nz0,1U + nc1 - nc0);
      if (nx0<0 || nx1>=width() || ny0<0 || ny1>=height() || nz0<0 || nz1>=depth() || nc0<0 || nc1>=spectrum()) {
        if (boundary_conditions) cimg_forXYZC(res,x,y,z,c) res(x,y,z,c) = _atXYZC(nx0+x,ny0+y,nz0+z,nc0+c);
        else res.fill(0).draw_image(-nx0,-ny0,-nz0,-nc0,*this);
      } else res.draw_image(-nx0,-ny0,-nz0,-nc0,*this);
      return res;
    }